

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cast.cpp
# Opt level: O2

BoundCastInfo *
duckdb::DefaultCasts::BitCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var2;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_88;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_80;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_78;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_70;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_68;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_60;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_58;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_50;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_48;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_40;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_38;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_30;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_28;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_20;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  LVar1 = target->id_;
  switch(LVar1) {
  case BOOLEAN:
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,bool,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_10._M_head_impl;
    break;
  case TINYINT:
    local_18._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,signed_char,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_18,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_18._M_head_impl;
    break;
  case SMALLINT:
    local_20._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,short,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_20,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_20._M_head_impl;
    break;
  case INTEGER:
    local_28._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,int,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_28,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_28._M_head_impl;
    break;
  case BIGINT:
    local_30._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,long,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_30,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_30._M_head_impl;
    break;
  case FLOAT:
    local_68._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,float,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_68,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_68._M_head_impl;
    break;
  case DOUBLE:
    local_70._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,double,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_70,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_70._M_head_impl;
    break;
  case VARCHAR:
    local_80._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<duckdb::string_t,duckdb::CastFromBitToString>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_80,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_80._M_head_impl;
    break;
  case BLOB:
    local_78._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<duckdb::string_t,duckdb::CastFromBitToBlob>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_78,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_78._M_head_impl;
    break;
  case UTINYINT:
    local_38._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,unsigned_char,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_38,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_38._M_head_impl;
    break;
  case USMALLINT:
    local_40._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,unsigned_short,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_40,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_40._M_head_impl;
    break;
  case UINTEGER:
    local_48._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,unsigned_int,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_48,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_48._M_head_impl;
    break;
  case UBIGINT:
    local_50._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TryCastErrorLoop<duckdb::string_t,unsigned_long,duckdb::CastFromBitToNumeric>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_50,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_50._M_head_impl;
    break;
  default:
    if (LVar1 == UHUGEINT) {
      local_60._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastErrorLoop<duckdb::string_t,duckdb::uhugeint_t,duckdb::CastFromBitToNumeric>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_60,(init_cast_local_state_t)0x0);
      _Var2._M_head_impl = local_60._M_head_impl;
      break;
    }
    if (LVar1 == HUGEINT) {
      local_58._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastErrorLoop<duckdb::string_t,duckdb::hugeint_t,duckdb::CastFromBitToNumeric>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_58,(init_cast_local_state_t)0x0);
      _Var2._M_head_impl = local_58._M_head_impl;
      break;
    }
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case DECIMAL:
  case CHAR:
  case INTERVAL:
    local_88._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_88,(init_cast_local_state_t)0x0);
    _Var2._M_head_impl = local_88._M_head_impl;
  }
  if (_Var2._M_head_impl != (BoundCastData *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_BoundCastData[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::BitCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	// Numerics
	case LogicalTypeId::BOOLEAN:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, bool, CastFromBitToNumeric>);
	case LogicalTypeId::TINYINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, int8_t, CastFromBitToNumeric>);
	case LogicalTypeId::SMALLINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, int16_t, CastFromBitToNumeric>);
	case LogicalTypeId::INTEGER:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, int32_t, CastFromBitToNumeric>);
	case LogicalTypeId::BIGINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, int64_t, CastFromBitToNumeric>);
	case LogicalTypeId::UTINYINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, uint8_t, CastFromBitToNumeric>);
	case LogicalTypeId::USMALLINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, uint16_t, CastFromBitToNumeric>);
	case LogicalTypeId::UINTEGER:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, uint32_t, CastFromBitToNumeric>);
	case LogicalTypeId::UBIGINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, uint64_t, CastFromBitToNumeric>);
	case LogicalTypeId::HUGEINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, hugeint_t, CastFromBitToNumeric>);
	case LogicalTypeId::UHUGEINT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, uhugeint_t, CastFromBitToNumeric>);
	case LogicalTypeId::FLOAT:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, float, CastFromBitToNumeric>);
	case LogicalTypeId::DOUBLE:
		return BoundCastInfo(&VectorCastHelpers::TryCastErrorLoop<string_t, double, CastFromBitToNumeric>);

	case LogicalTypeId::BLOB:
		return BoundCastInfo(&VectorCastHelpers::StringCast<string_t, CastFromBitToBlob>);

	case LogicalTypeId::VARCHAR:
		return BoundCastInfo(&VectorCastHelpers::StringCast<string_t, CastFromBitToString>);

	default:
		return DefaultCasts::TryVectorNullCast;
	}
}